

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O2

set_entry * set_search(set *ht,uint32_t hash,void *key)

{
  uint d;
  uint32_t *puVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  set_entry *psVar6;
  uint uVar7;
  uint32_t uVar8;
  
  if ((key == (void *)0x0) || ((uint32_t *)key == &deleted_key_value)) {
    __assert_fail("!key_pointer_is_reserved(key)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/set.c"
                  ,0xdf,"struct set_entry *set_search(const struct set *, uint32_t, const void *)");
  }
  d = ht->size;
  uVar3 = util_fast_urem32(hash,d,ht->size_magic);
  uVar4 = util_fast_urem32(hash,ht->rehash,ht->rehash_magic);
  uVar8 = uVar3;
  while( true ) {
    puVar1 = (uint32_t *)ht->table[uVar8].key;
    if (puVar1 == (uint32_t *)0x0) {
      return (set_entry *)0x0;
    }
    if (((puVar1 != &deleted_key_value) && (psVar6 = ht->table + uVar8, psVar6->hash == hash)) &&
       (_Var2 = (*ht->key_equals_function)(key,puVar1), _Var2)) break;
    uVar7 = uVar8 + uVar4 + 1;
    uVar5 = d;
    if (uVar7 < d) {
      uVar5 = 0;
    }
    uVar8 = uVar7 - uVar5;
    if (uVar8 == uVar3) {
      return (set_entry *)0x0;
    }
  }
  return psVar6;
}

Assistant:

static struct set_entry *
set_search(const struct set *ht, uint32_t hash, const void *key)
{
   assert(!key_pointer_is_reserved(key));

   uint32_t size = ht->size;
   uint32_t start_address = util_fast_urem32(hash, size, ht->size_magic);
   uint32_t double_hash = util_fast_urem32(hash, ht->rehash,
                                           ht->rehash_magic) + 1;
   uint32_t hash_address = start_address;
   do {
      struct set_entry *entry = ht->table + hash_address;

      if (entry_is_free(entry)) {
         return NULL;
      } else if (entry_is_present(entry) && entry->hash == hash) {
         if (ht->key_equals_function(key, entry->key)) {
            return entry;
         }
      }

      hash_address += double_hash;
      if (hash_address >= size)
         hash_address -= size;
   } while (hash_address != start_address);

   return NULL;
}